

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::AdvancedLargeStrideAndOffsetsNewAndLegacyAPI::Cleanup
          (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glDisable(this_00,0x8c89);
  if (this->pipeline == true) {
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_vsp);
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_fsp);
    glu::CallLogWrapper::glDeleteProgramPipelines(this_00,1,&this->m_ppo);
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,0);
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_ppo);
  }
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_ssbo);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vao);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_vbo);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDisable(GL_RASTERIZER_DISCARD);
		if (pipeline)
		{
			glDeleteProgram(m_vsp);
			glDeleteProgram(m_fsp);
			glDeleteProgramPipelines(1, &m_ppo);
		}
		else
		{
			glUseProgram(0);
			glDeleteProgram(m_ppo);
		}
		glDeleteBuffers(1, &m_ssbo);
		glDeleteVertexArrays(1, &m_vao);
		glDeleteBuffers(1, &m_vbo);
		return NO_ERROR;
	}